

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O0

void __thiscall
wasm::SimplifyLocals<true,_true,_true>::optimizeIfElseReturn
          (SimplifyLocals<true,_true,_true> *this,If *iff,Expression **currp,Sinkables *ifTrue)

{
  Expression *pEVar1;
  Block *pBVar2;
  Sinkables *this_00;
  bool bVar3;
  pointer ppVar4;
  size_type sVar5;
  ExpressionList *pEVar6;
  mapped_type *pmVar7;
  size_t sVar8;
  Expression **ppEVar9;
  Module *wasm;
  LocalSet *pLVar10;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type__01;
  Builder local_120 [2];
  LocalSet *newLocalSet;
  optional<wasm::Type> local_108;
  BasicType local_f8 [2];
  optional<wasm::Type> local_f0;
  Expression **local_e0;
  Expression **ifFalseItem;
  BasicType local_d0 [2];
  optional<wasm::Type> local_c8;
  Expression **local_b8;
  Expression **ifTrueItem;
  Block *local_a8;
  Block *ifFalseBlock;
  Block *local_98;
  Block *ifTrueBlock;
  type *_;
  type *index;
  _Self local_78;
  iterator __end0;
  iterator __begin0;
  Sinkables *__range4;
  BasicType local_58 [2];
  _Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>
  local_50;
  BasicType local_48 [2];
  byte local_3d;
  key_type local_3c;
  bool found;
  Sinkables *pSStack_38;
  Index goodIndex;
  Sinkables *ifFalse;
  Sinkables *local_28;
  Sinkables *ifTrue_local;
  Expression **currp_local;
  If *iff_local;
  SimplifyLocals<true,_true,_true> *this_local;
  
  local_28 = ifTrue;
  ifTrue_local = (Sinkables *)currp;
  currp_local = (Expression **)iff;
  iff_local = (If *)this;
  if (iff->ifFalse == (Expression *)0x0) {
    __assert_fail("iff->ifFalse",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                  ,0x27a,
                  "void wasm::SimplifyLocals<>::optimizeIfElseReturn(If *, Expression **, Sinkables &) [allowTee = true, allowStructure = true, allowNesting = true]"
                 );
  }
  ifFalse._4_4_ = 0;
  bVar3 = wasm::Type::operator!=
                    (&(iff->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type
                     ,(BasicType *)((long)&ifFalse + 4));
  if (bVar3) {
    return;
  }
  pSStack_38 = &this->sinkables;
  local_3c = 0xffffffff;
  local_3d = 0;
  local_48[1] = 1;
  bVar3 = wasm::Type::operator==(&currp_local[3]->type,local_48 + 1);
  if (bVar3) {
    local_48[0] = unreachable;
    bVar3 = wasm::Type::operator!=(&currp_local[4]->type,local_48);
    if (!bVar3) {
      __assert_fail("iff->ifFalse->type != Type::unreachable",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                    ,0x295,
                    "void wasm::SimplifyLocals<>::optimizeIfElseReturn(If *, Expression **, Sinkables &) [allowTee = true, allowStructure = true, allowNesting = true]"
                   );
    }
    bVar3 = std::
            map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
            ::empty(pSStack_38);
    if (!bVar3) {
      local_50._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
           ::begin(pSStack_38);
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>
               ::operator->(&local_50);
      local_3c = ppVar4->first;
      local_3d = 1;
    }
  }
  else {
    local_58[1] = 1;
    bVar3 = wasm::Type::operator==(&currp_local[4]->type,local_58 + 1);
    this_00 = local_28;
    if (bVar3) {
      local_58[0] = unreachable;
      bVar3 = wasm::Type::operator!=(&currp_local[3]->type,local_58);
      if (!bVar3) {
        __assert_fail("iff->ifTrue->type != Type::unreachable",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                      ,0x29c,
                      "void wasm::SimplifyLocals<>::optimizeIfElseReturn(If *, Expression **, Sinkables &) [allowTee = true, allowStructure = true, allowNesting = true]"
                     );
      }
      bVar3 = std::
              map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
              ::empty(local_28);
      if (!bVar3) {
        __range4 = (Sinkables *)
                   std::
                   map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                   ::begin(local_28);
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>
                               *)&__range4);
        local_3c = ppVar4->first;
        local_3d = 1;
      }
    }
    else {
      __end0 = std::
               map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
               ::begin(local_28);
      local_78._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
           ::end(this_00);
      while (bVar3 = std::operator!=(&__end0,&local_78), bVar3) {
        index = &std::
                 _Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>
                 ::operator*(&__end0)->first;
        _ = (type *)std::
                    get<0ul,unsigned_int_const,wasm::SimplifyLocals<true,true,true>::SinkableInfo>
                              ((pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>
                                *)index);
        ifTrueBlock = (Block *)std::
                               get<1ul,unsigned_int_const,wasm::SimplifyLocals<true,true,true>::SinkableInfo>
                                         ((pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>
                                           *)index);
        sVar5 = std::
                map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                ::count(pSStack_38,(key_type *)_);
        if (sVar5 != 0) {
          local_3c = *(key_type *)&_->item;
          local_3d = 1;
          break;
        }
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>
        ::operator++(&__end0);
      }
    }
  }
  if ((local_3d & 1) == 0) {
    return;
  }
  local_98 = Expression::dynCast<wasm::Block>(currp_local[3]);
  ifFalseBlock._4_4_ = 1;
  bVar3 = wasm::Type::operator!=(&currp_local[3]->type,(BasicType *)((long)&ifFalseBlock + 4));
  if (bVar3) {
    if (((local_98 == (Block *)0x0) || (bVar3 = IString::is(&(local_98->name).super_IString), bVar3)
        ) || (sVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                                (&(local_98->list).
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                ), sVar8 == 0)) {
LAB_0221eac6:
      std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::push_back
                (&this->ifsToEnlarge,(value_type *)&currp_local);
      return;
    }
    ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                        (&(local_98->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    bVar3 = Expression::is<wasm::Nop>(*ppEVar9);
    if (!bVar3) goto LAB_0221eac6;
  }
  local_a8 = Expression::dynCast<wasm::Block>(currp_local[4]);
  ifTrueItem._4_4_ = 1;
  bVar3 = wasm::Type::operator!=(&currp_local[4]->type,(BasicType *)((long)&ifTrueItem + 4));
  if (bVar3) {
    if (((local_a8 != (Block *)0x0) &&
        (bVar3 = IString::is(&(local_a8->name).super_IString), !bVar3)) &&
       (sVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                          (&(local_a8->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          ), sVar8 != 0)) {
      ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                          (&(local_a8->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
      bVar3 = Expression::is<wasm::Nop>(*ppEVar9);
      if (bVar3) goto LAB_0221eb8e;
    }
    std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::push_back
              (&this->ifsToEnlarge,(value_type *)&currp_local);
  }
  else {
LAB_0221eb8e:
    ifTrueItem._0_4_ = 1;
    bVar3 = wasm::Type::operator!=(&currp_local[3]->type,(BasicType *)&ifTrueItem);
    if (bVar3) {
      pmVar7 = std::
               map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
               ::at(local_28,&local_3c);
      local_b8 = pmVar7->item;
      pLVar10 = Expression::cast<wasm::LocalSet>(*local_b8);
      pEVar1 = pLVar10->value;
      pEVar6 = &local_98->list;
      sVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(local_98->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
      ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&pEVar6->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,sVar8 - 1);
      *ppEVar9 = pEVar1;
      ExpressionManipulator::nop<wasm::Expression>(*local_b8);
      pBVar2 = local_98;
      std::optional<wasm::Type>::optional(&local_c8);
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_7_ = 0;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           local_c8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_payload;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged =
           local_c8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_engaged;
      Block::finalize(pBVar2,type_,Unknown);
      local_d0[0] = none;
      bVar3 = wasm::Type::operator!=
                        (&(local_98->super_SpecificExpression<(wasm::Expression::Id)1>).
                          super_Expression.type,local_d0);
      if (!bVar3) {
        __assert_fail("ifTrueBlock->type != Type::none",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                      ,0x2ca,
                      "void wasm::SimplifyLocals<>::optimizeIfElseReturn(If *, Expression **, Sinkables &) [allowTee = true, allowStructure = true, allowNesting = true]"
                     );
      }
    }
    ifFalseItem._4_4_ = 1;
    bVar3 = wasm::Type::operator!=(&currp_local[4]->type,(BasicType *)((long)&ifFalseItem + 4));
    if (bVar3) {
      pmVar7 = std::
               map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
               ::at(pSStack_38,&local_3c);
      local_e0 = pmVar7->item;
      pLVar10 = Expression::cast<wasm::LocalSet>(*local_e0);
      pEVar1 = pLVar10->value;
      pEVar6 = &local_a8->list;
      sVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(local_a8->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
      ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&pEVar6->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,sVar8 - 1);
      *ppEVar9 = pEVar1;
      ExpressionManipulator::nop<wasm::Expression>(*local_e0);
      pBVar2 = local_a8;
      std::optional<wasm::Type>::optional(&local_f0);
      type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_7_ = 0;
      type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           local_f0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_payload;
      type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged =
           local_f0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_engaged;
      Block::finalize(pBVar2,type__00,Unknown);
      local_f8[0] = none;
      bVar3 = wasm::Type::operator!=
                        (&(local_a8->super_SpecificExpression<(wasm::Expression::Id)1>).
                          super_Expression.type,local_f8);
      if (!bVar3) {
        __assert_fail("ifFalseBlock->type != Type::none",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                      ,0x2d2,
                      "void wasm::SimplifyLocals<>::optimizeIfElseReturn(If *, Expression **, Sinkables &) [allowTee = true, allowStructure = true, allowNesting = true]"
                     );
      }
    }
    ppEVar9 = currp_local;
    std::optional<wasm::Type>::optional(&local_108);
    type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_108.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_108.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    If::finalize((If *)ppEVar9,type__01);
    newLocalSet._0_4_ = 0;
    bVar3 = wasm::Type::operator!=((Type *)(currp_local + 1),(BasicType *)&newLocalSet);
    if (!bVar3) {
      __assert_fail("iff->type != Type::none",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                    ,0x2d5,
                    "void wasm::SimplifyLocals<>::optimizeIfElseReturn(If *, Expression **, Sinkables &) [allowTee = true, allowStructure = true, allowNesting = true]"
                   );
    }
    wasm = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
           ::getModule((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                        *)&(this->
                           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                           ).
                           super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                      );
    Builder::Builder(local_120,wasm);
    pLVar10 = Builder::makeLocalSet(local_120,local_3c,(Expression *)currp_local);
    *(LocalSet **)&(ifTrue_local->_M_t)._M_impl = pLVar10;
    this->anotherCycle = true;
  }
  return;
}

Assistant:

void optimizeIfElseReturn(If* iff, Expression** currp, Sinkables& ifTrue) {
    assert(iff->ifFalse);
    // if this if already has a result, or is unreachable code, we have
    // nothing to do
    if (iff->type != Type::none) {
      return;
    }
    // We now have the sinkables from both sides of the if, and can look
    // for something to sink. That is either a shared index on both sides,
    // *or* if one side is unreachable, we can sink anything from the other,
    //   (if
    //     (..)
    //     (br $x)
    //     (local.set $y (..))
    //   )
    //    =>
    //   (local.set $y
    //     (if (result i32)
    //       (..)
    //       (br $x)
    //       (..)
    //     )
    //   )
    Sinkables& ifFalse = sinkables;
    Index goodIndex = -1;
    bool found = false;
    if (iff->ifTrue->type == Type::unreachable) {
      // since the if type is none
      assert(iff->ifFalse->type != Type::unreachable);
      if (!ifFalse.empty()) {
        goodIndex = ifFalse.begin()->first;
        found = true;
      }
    } else if (iff->ifFalse->type == Type::unreachable) {
      // since the if type is none
      assert(iff->ifTrue->type != Type::unreachable);
      if (!ifTrue.empty()) {
        goodIndex = ifTrue.begin()->first;
        found = true;
      }
    } else {
      // Look for a shared index.
      for (auto& [index, _] : ifTrue) {
        if (ifFalse.count(index) > 0) {
          goodIndex = index;
          found = true;
          break;
        }
      }
    }
    if (!found) {
      return;
    }
    // great, we can optimize!
    // ensure we have a place to write the return values for, if not, we
    // need another cycle
    auto* ifTrueBlock = iff->ifTrue->dynCast<Block>();
    if (iff->ifTrue->type != Type::unreachable) {
      if (!ifTrueBlock || ifTrueBlock->name.is() ||
          ifTrueBlock->list.size() == 0 ||
          !ifTrueBlock->list.back()->is<Nop>()) {
        ifsToEnlarge.push_back(iff);
        return;
      }
    }
    auto* ifFalseBlock = iff->ifFalse->dynCast<Block>();
    if (iff->ifFalse->type != Type::unreachable) {
      if (!ifFalseBlock || ifFalseBlock->name.is() ||
          ifFalseBlock->list.size() == 0 ||
          !ifFalseBlock->list.back()->is<Nop>()) {
        ifsToEnlarge.push_back(iff);
        return;
      }
    }
    // all set, go
    if (iff->ifTrue->type != Type::unreachable) {
      auto* ifTrueItem = ifTrue.at(goodIndex).item;
      ifTrueBlock->list[ifTrueBlock->list.size() - 1] =
        (*ifTrueItem)->template cast<LocalSet>()->value;
      ExpressionManipulator::nop(*ifTrueItem);
      ifTrueBlock->finalize();
      assert(ifTrueBlock->type != Type::none);
    }
    if (iff->ifFalse->type != Type::unreachable) {
      auto* ifFalseItem = ifFalse.at(goodIndex).item;
      ifFalseBlock->list[ifFalseBlock->list.size() - 1] =
        (*ifFalseItem)->template cast<LocalSet>()->value;
      ExpressionManipulator::nop(*ifFalseItem);
      ifFalseBlock->finalize();
      assert(ifFalseBlock->type != Type::none);
    }
    iff->finalize(); // update type
    assert(iff->type != Type::none);
    // finally, create a local.set on the iff itself
    auto* newLocalSet =
      Builder(*this->getModule()).makeLocalSet(goodIndex, iff);
    *currp = newLocalSet;
    anotherCycle = true;
  }